

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::BeginEnumValues(GoGenerator *this,EnumDef *enum_def,string *code_ptr)

{
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_48;
  string *local_28;
  string *code;
  string *code_ptr_local;
  EnumDef *enum_def_local;
  GoGenerator *this_local;
  
  local_28 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)enum_def;
  enum_def_local = (EnumDef *)this;
  std::__cxx11::string::operator+=((string *)code_ptr,"var EnumValues");
  IdlNamer::Type_abi_cxx11_(&local_48,&this->namer_,(EnumDef *)code_ptr_local);
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  GetEnumTypeName_abi_cxx11_(&local_b8,this,(EnumDef *)code_ptr_local);
  std::operator+(&local_98," = map[string]",&local_b8);
  std::operator+(&local_78,&local_98,"{\n");
  std::__cxx11::string::operator+=((string *)local_28,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

void BeginEnumValues(const EnumDef &enum_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "var EnumValues";
    code += namer_.Type(enum_def);
    code += " = map[string]" + GetEnumTypeName(enum_def) + "{\n";
  }